

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O0

int __thiscall soul::Compiler::link(Compiler *this,char *__from,char *__to)

{
  bool bVar1;
  Namespace *pNVar2;
  StringDictionary *this_00;
  Module *pMVar3;
  BuildSettings *in_RCX;
  duration in_R8;
  double __x;
  string_view moduleName;
  anon_class_8_1_70e95164 aStack_1f0;
  AbortCompilationException anon_var_1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  BuildSettings local_1a8;
  undefined1 local_d9;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  CodeLocation local_c8;
  undefined1 local_b8 [8];
  CompileMessageHandler handler;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  ScopedTimer timer___LINE__;
  ProcessorBase *processorToRun_local;
  BuildSettings *settings_local;
  CompileMessageList *messageList_local;
  Compiler *this_local;
  Program *program;
  
  timer___LINE__.start.__d.__r = (duration)(duration)in_R8.__r;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"link time",&local_79);
  ScopedTimer::ScopedTimer((ScopedTimer *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  CompileMessageHandler::CompileMessageHandler
            ((CompileMessageHandler *)local_b8,(CompileMessageList *)__to);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*
                     ((pool_ptr<soul::AST::Namespace> *)(__from + 0x60));
  ASTUtilities::resolveHoistedEndpoints((Allocator *)__from,&pNVar2->super_ModuleBase);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*
                     ((pool_ptr<soul::AST::Namespace> *)(__from + 0x60));
  ASTUtilities::mergeDuplicateNamespaces(pNVar2);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*
                     ((pool_ptr<soul::AST::Namespace> *)(__from + 0x60));
  ASTUtilities::removeModulesWithSpecialisationParams(pNVar2);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*
                     ((pool_ptr<soul::AST::Namespace> *)(__from + 0x60));
  ResolutionPass::run((Allocator *)__from,&pNVar2->super_ModuleBase,false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"soul.complex")
  ;
  moduleName._M_str = (char *)local_d8._M_len;
  moduleName._M_len = (size_t)&local_c8;
  getSystemModule(moduleName);
  compile((Compiler *)__from,&local_c8);
  CodeLocation::~CodeLocation(&local_c8);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*
                     ((pool_ptr<soul::AST::Namespace> *)(__from + 0x60));
  ConvertComplexPass::run((Allocator *)__from,pNVar2);
  ASTUtilities::connectAnyChildEndpointsNeedingToBeExposed
            ((Allocator *)__from,(ProcessorBase *)timer___LINE__.start.__d.__r);
  local_d9 = 0;
  Program::Program((Program *)this);
  this_00 = Program::getStringDictionary((Program *)this);
  StringDictionary::operator=(this_00,(StringDictionary *)(__from + 0x38));
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*
                     ((pool_ptr<soul::AST::Namespace> *)(__from + 0x60));
  compileAllModules((Compiler *)__from,pNVar2,(Program *)this,
                    (ProcessorBase *)timer___LINE__.start.__d.__r);
  heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<soul::Optimisations>((Program *)this);
  BuildSettings::BuildSettings(&local_1a8,in_RCX);
  heart::Checker::sanityCheck((Program *)this,&local_1a8);
  BuildSettings::~BuildSettings(&local_1a8);
  if (in_RCX->optimisationLevel != 0) {
    Optimisations::removeUnusedObjects((Program *)this);
  }
  reset((Compiler *)__from);
  bVar1 = Logger::isLoggingEnabled();
  if (bVar1) {
    pMVar3 = Program::getMainProcessor((Program *)this);
    std::operator+(&local_1c8,&pMVar3->originalFullName,": linked HEART");
    aStack_1f0.program = (Program *)this;
    std::function<std::__cxx11::string()>::
    function<soul::Compiler::link(soul::CompileMessageList&,soul::BuildSettings_const&,soul::AST::ProcessorBase&)::__0,void>
              ((function<std::__cxx11::string()> *)&local_1e8,&stack0xfffffffffffffe10);
    Logger::log((Logger *)&local_1c8,__x);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    ~function(&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  heart::Checker::testHEARTRoundTrip((Program *)this);
  Optimisations::optimiseFunctionBlocks((Program *)this);
  Optimisations::removeUnusedVariables((Program *)this);
  local_d9 = 1;
  CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)local_b8);
  ScopedTimer::~ScopedTimer((ScopedTimer *)local_58);
  return (int)this;
}

Assistant:

Program Compiler::link (CompileMessageList& messageList, const BuildSettings& settings, AST::ProcessorBase& processorToRun)
{
    try
    {
        SOUL_LOG_TIME_OF_SCOPE ("link time");
        CompileMessageHandler handler (messageList);
        ASTUtilities::resolveHoistedEndpoints (allocator, *topLevelNamespace);
        ASTUtilities::mergeDuplicateNamespaces (*topLevelNamespace);
        ASTUtilities::removeModulesWithSpecialisationParams (*topLevelNamespace);
        ResolutionPass::run (allocator, *topLevelNamespace, false);

        compile (getSystemModule ("soul.complex"));
        ConvertComplexPass::run (allocator, *topLevelNamespace);

        ASTUtilities::connectAnyChildEndpointsNeedingToBeExposed (allocator, processorToRun);

        Program program;
        program.getStringDictionary() = allocator.stringDictionary;  // Bring the existing string dictionary along so that the handles match
        compileAllModules (*topLevelNamespace, program, processorToRun);
        heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<Optimisations> (program);
        heart::Checker::sanityCheck (program, settings);

        if (settings.optimisationLevel != 0)
        {
            Optimisations::removeUnusedObjects (program);
        }

        reset();

        SOUL_LOG (program.getMainProcessor().originalFullName + ": linked HEART",
                  [&] { return program.toHEART(); });

        heart::Checker::testHEARTRoundTrip (program);
        Optimisations::optimiseFunctionBlocks (program);
        Optimisations::removeUnusedVariables (program);

        return program;
    }
    catch (AbortCompilationException) {}

    return {};
}